

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O1

void Macro_smpsHeaderPSG(uint arg_count,long *arg_array)

{
  uchar byte;
  uchar uVar1;
  
  if (4 < arg_count) {
    CheckedChannelPointer((uint)*arg_array);
    byte = (uchar)arg_array[1];
    if (source_driver < 3 && 2 < target_driver) {
      byte = byte + '\f';
    }
    else {
      uVar1 = byte + 0xf4;
      if (source_driver < 3) {
        uVar1 = byte;
      }
      if (target_driver < 3) {
        byte = uVar1;
      }
    }
    MemoryStream_WriteByte(output_stream,byte);
    MemoryStream_WriteByte(output_stream,(uchar)arg_array[2]);
    MemoryStream_WriteByte(output_stream,(uchar)arg_array[3]);
    MemoryStream_WriteByte(output_stream,(uchar)arg_array[4]);
    return;
  }
  __assert_fail("arg_count >= 5",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                ,0x1d2,"void Macro_smpsHeaderPSG(unsigned int, long *)");
}

Assistant:

static void Macro_smpsHeaderPSG(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 5);

	CheckedChannelPointer(arg_array[0]);		// Location
	WriteByte(PSGPitchConvert(arg_array[1]));	// Pitch
	WriteByte(arg_array[2]);			// Volume
	WriteByte(arg_array[3]);			// Modulation
	WriteByte(arg_array[4]);			// Instrument
}